

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O3

Rect __thiscall lunasvg::SVGLineElement::updateShape(SVGLineElement *this,Path *path)

{
  float y;
  float x;
  float y_00;
  Rect RVar1;
  LengthContext lengthContext;
  LengthContext local_28;
  
  local_28.m_units = UserSpaceOnUse;
  local_28.m_element = (SVGElement *)this;
  RVar1.x = LengthContext::valueForLength
                      (&local_28,(Length *)&(this->m_x1).super_SVGProperty.field_0xc,
                       (this->m_x1).super_SVGProperty.field_0x9);
  y = LengthContext::valueForLength
                (&local_28,(Length *)&(this->m_y1).super_SVGProperty.field_0xc,
                 (this->m_y1).super_SVGProperty.field_0x9);
  x = LengthContext::valueForLength
                (&local_28,(Length *)&(this->m_x2).super_SVGProperty.field_0xc,
                 (this->m_x2).super_SVGProperty.field_0x9);
  y_00 = LengthContext::valueForLength
                   (&local_28,(Length *)&(this->m_y2).super_SVGProperty.field_0xc,
                    (this->m_y2).super_SVGProperty.field_0x9);
  Path::moveTo(path,RVar1.x,y);
  Path::lineTo(path,x,y_00);
  RVar1.w = x - RVar1.x;
  RVar1.h = y_00 - y;
  RVar1.y = y;
  return RVar1;
}

Assistant:

Rect SVGLineElement::updateShape(Path& path)
{
    LengthContext lengthContext(this);
    auto x1 = lengthContext.valueForLength(m_x1);
    auto y1 = lengthContext.valueForLength(m_y1);
    auto x2 = lengthContext.valueForLength(m_x2);
    auto y2 = lengthContext.valueForLength(m_y2);

    path.moveTo(x1, y1);
    path.lineTo(x2, y2);
    return Rect(x1, y1, x2 - x1, y2 - y1);
}